

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Decompose_LDLt(TPZSkylMatrix<std::complex<double>_> *this)

{
  complex<double> *pcVar1;
  undefined8 uVar2;
  complex<double> a;
  long lVar3;
  bool bVar4;
  complex<double> **ppcVar5;
  complex<double> *pcVar6;
  int64_t iVar7;
  int64_t iVar8;
  ostream *poVar9;
  long *in_RDI;
  char *in_stack_00000048;
  char *in_stack_00000050;
  complex<double> *diagptr;
  int64_t k;
  complex<double> sum;
  TPZVec<std::complex<double>_> diag;
  int64_t dimension;
  int64_t minrow;
  int64_t minl;
  int64_t minj;
  int64_t l;
  int64_t j;
  complex<double> *ell;
  complex<double> *elj;
  complex<double> *in_stack_fffffffffffffe48;
  TPZVec<std::complex<double>_> *in_stack_fffffffffffffe50;
  ostream *in_stack_fffffffffffffe58;
  TPZSkylMatrix<std::complex<double>_> *in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe88;
  TPZVec<std::complex<double>_> *in_stack_fffffffffffffe90;
  int64_t local_130;
  complex<double> *local_a0;
  int64_t local_98;
  complex<double> local_90 [2];
  TPZVec<std::complex<double>_> local_70;
  long local_50;
  int64_t local_48;
  long local_40;
  long local_38;
  long local_30;
  int64_t local_28;
  complex *local_20;
  complex *local_18;
  int local_4;
  
  if ((char)in_RDI[3] == '\x04') {
    local_4 = 1;
  }
  else {
    if ((char)in_RDI[3] != '\0') {
      TPZMatrix<std::complex<double>_>::Error(in_stack_00000050,in_stack_00000048);
    }
    local_50 = (**(code **)(*in_RDI + 0x60))();
    TPZVec<std::complex<double>_>::TPZVec(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
      ppcVar5 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_28);
      pcVar1 = *ppcVar5;
      pcVar6 = TPZVec<std::complex<double>_>::operator[](&local_70,local_28);
      *(undefined8 *)pcVar6->_M_value = *(undefined8 *)pcVar1->_M_value;
      *(undefined8 *)(pcVar6->_M_value + 8) = *(undefined8 *)(pcVar1->_M_value + 8);
    }
    std::complex<double>::complex(local_90,0.0,0.0);
    for (local_28 = 1; iVar8 = local_28, local_28 < local_50; local_28 = local_28 + 1) {
      iVar7 = Size(in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58);
      local_38 = (iVar8 - iVar7) + 1;
      for (local_30 = local_38; lVar3 = local_30, local_30 <= local_28; local_30 = local_30 + 1) {
        iVar8 = Size(in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58);
        local_40 = (lVar3 - iVar8) + 1;
        local_130 = local_40;
        if (local_40 <= local_38) {
          local_130 = local_38;
        }
        local_48 = local_130;
        local_98 = local_130;
        ppcVar5 = TPZVec<std::complex<double>_*>::operator[]
                            ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_28);
        local_18 = (complex *)(*ppcVar5 + (local_28 - local_48));
        ppcVar5 = TPZVec<std::complex<double>_*>::operator[]
                            ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_30);
        local_20 = (complex *)(*ppcVar5 + (local_30 - local_48));
        local_a0 = TPZVec<std::complex<double>_>::operator[](&local_70,local_130);
        std::complex<double>::operator=(local_90,0.0);
        for (; local_98 < local_30; local_98 = local_98 + 1) {
          local_18 = local_18 + -0x10;
          local_20 = local_20 + -0x10;
          std::conj<double>((complex<double> *)in_stack_fffffffffffffe50);
          std::operator*(in_stack_fffffffffffffe48,(complex<double> *)0x137cb4d);
          local_a0 = local_a0 + 1;
          std::operator*(in_stack_fffffffffffffe48,(complex<double> *)0x137cb9d);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        }
        std::complex<double>::operator-=
                  ((complex<double> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (local_20 == local_18) {
          a._M_value._8_8_ = in_stack_fffffffffffffe60;
          a._M_value._0_8_ = in_stack_fffffffffffffe58;
          bVar4 = IsZero(a);
          if (bVar4) {
            uVar2 = *(undefined8 *)(local_18 + 8);
            *(undefined8 *)local_a0->_M_value = *(undefined8 *)local_18;
            *(undefined8 *)(local_a0->_M_value + 8) = uVar2;
            poVar9 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix pivot = ");
            poVar9 = std::operator<<(poVar9,local_18);
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::DecomposeLDLt zero pivot\n");
            in_stack_fffffffffffffe60 =
                 (TPZSkylMatrix<std::complex<double>_> *)
                 std::operator<<((ostream *)&std::cout,"j = ");
            in_stack_fffffffffffffe58 =
                 (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe60,local_28);
            in_stack_fffffffffffffe50 =
                 (TPZVec<std::complex<double>_> *)std::operator<<(in_stack_fffffffffffffe58," l = ")
            ;
            in_stack_fffffffffffffe48 =
                 (complex<double> *)std::ostream::operator<<(in_stack_fffffffffffffe50,local_30);
            std::ostream::operator<<
                      (in_stack_fffffffffffffe48,std::endl<char,std::char_traits<char>>);
          }
          else {
            *(undefined8 *)local_a0->_M_value = *(undefined8 *)local_18;
            *(undefined8 *)(local_a0->_M_value + 8) = *(undefined8 *)(local_18 + 8);
          }
        }
        else {
          std::complex<double>::operator/=
                    ((complex<double> *)in_stack_fffffffffffffe60,
                     (complex<double> *)in_stack_fffffffffffffe58);
        }
      }
    }
    *(undefined1 *)(in_RDI + 3) = 4;
    *(undefined1 *)((long)in_RDI + 0x19) = 0;
    local_4 = 1;
    TPZVec<std::complex<double>_>::~TPZVec(in_stack_fffffffffffffe50);
  }
  return local_4;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt()
{
    
    if( this->fDecomposed == ELDLt) return 1;
    if (  this->fDecomposed )
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt()");
#endif
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TPZVec<TVar> diag(dimension);
    for(j=0; j<dimension; j++)
    {
        diag[j] = *fElem[j];
    }
    
    //std::cout << "TPZSkylMatrix<TVar>::Decompose_LDLt: dimension = " << dimension  << std::endl;
    
    TVar sum;
    j = 1;
    while(j < dimension) {
        /*    if(!(j%100) && Dim() > 100) {
         cout <<  j << ' ';
         cout.flush();
         }
         if(!(j%1000)) cout << endl;*/
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            TVar *diagptr = &diag[k];
            sum = 0.;
            while(k < l) {
                //		  sum += *elj-- * *ell-- * *(fElem[k++]);
                //EBORIN: trocar *diagptr++ por *diagptr-- ajuda na vetorização?
                if constexpr(is_complex<TVar>::value){
                    sum += (*elj--) * std::conj(*ell--) * (*diagptr++);
                }else{
                    sum += (*elj--) * (*ell--) * (*diagptr++);
                }
                k++;
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
#ifdef PZ_LOG
                std::stringstream sout;
                sout << "col = " << j << " diagonal " << *elj;
                LOGPZ_DEBUG(logger,sout.str())
#endif
                
                *diagptr = *elj;
                cout << "TPZSkylMatrix pivot = " << *elj << endl;
                cout << "TPZSkylMatrix::DecomposeLDLt zero pivot\n";
                cout << "j = " << j << " l = " << l << endl;
            }
            else
            {
                *diagptr = *elj;
            }
            l++;
        }
        j++;
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}